

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

bool __thiscall
QPDFNumberTreeObjectHelper::findObjectAtOrBelow
          (QPDFNumberTreeObjectHelper *this,numtree_number idx,QPDFObjectHandle *oh,
          numtree_number *offset)

{
  numtree_number nVar1;
  bool bVar2;
  numtree_number idx_local;
  iterator i;
  iterator local_50;
  
  idx_local = idx;
  find(&i,this,idx,true);
  end(&local_50,this);
  bVar2 = NNTreeIterator::operator==
                    (i.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     local_50.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  iterator::~iterator(&local_50);
  if (!bVar2) {
    iterator::updateIValue(&i);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)oh,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&i.ivalue.second);
    iterator::updateIValue(&i);
    QIntC::range_check_subtract<long_long>(&idx_local,&i.ivalue.first);
    nVar1 = idx_local;
    iterator::updateIValue(&i);
    *offset = nVar1 - i.ivalue.first;
  }
  iterator::~iterator(&i);
  return !bVar2;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::findObjectAtOrBelow(
    numtree_number idx, QPDFObjectHandle& oh, numtree_number& offset)
{
    auto i = find(idx, true);
    if (i == end()) {
        return false;
    }
    oh = i->second;
    QIntC::range_check_subtract(idx, i->first);
    offset = idx - i->first;
    return true;
}